

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O1

void __thiscall xray_re::xr_sound_src_object::save_v12(xr_sound_src_object *this,xr_ini_writer *w)

{
  pointer pcVar1;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_06;
  void *__buf_07;
  long *local_40 [2];
  long local_30 [2];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  xr_ini_writer::write(w,0x1f26ef,__buf,in_RCX);
  xr_ini_writer::write
            (w,0x1e66ca,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,in_RCX);
  xr_ini_writer::write(w,0x1f26fb,__buf_00,in_RCX);
  xr_ini_writer::write(w,0x1f2700,__buf_01,in_RCX);
  xr_ini_writer::write(w,0x1f270c,__buf_02,in_RCX);
  xr_ini_writer::write(w,0x1f2715,__buf_03,in_RCX);
  xr_ini_writer::write(w,0x1f271e,__buf_04,in_RCX);
  xr_ini_writer::write(w,0x1f2728,__buf_05,in_RCX);
  pcVar1 = (this->m_source_name)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->m_source_name)._M_string_length);
  __n = 0;
  xr_ini_writer::write(w,0x1f2735,(string *)local_40,0);
  __buf_06 = extraout_RDX;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    __buf_06 = extraout_RDX_00;
  }
  xr_ini_writer::write(w,0x1f273e,__buf_06,__n);
  xr_ini_writer::write(w,0x1f274b,(void *)(ulong)this->m_type,__n);
  xr_ini_writer::write(w,0x1f3d25,(void *)0x14,__n);
  xr_ini_writer::write(w,0x1f2754,__buf_07,__n);
  return;
}

Assistant:

void xr_sound_src_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("active_time", m_active_time);
	w->write("flags", m_flags);
	w->write("freq", m_frequency);
	w->write("max_ai_dist", m_max_ai_dist);
	w->write("max_dist", m_max_dist);
	w->write("min_dist", m_min_dist);
	w->write("play_time", m_play_time);
	w->write("random_pause", m_pause_time);
	w->write("snd_name", m_source_name, false);
	w->write("snd_position", m_sound_pos);
	w->write("snd_type", m_type);

	w->write("version", SOUNDSRC_VERSION);
	w->write("volume", m_volume);
}